

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_load_reference(cram_fd *fd,char *fn)

{
  int iVar1;
  refs_t *prVar2;
  char *local_40;
  bool local_21;
  char *local_20;
  char *fn_local;
  cram_fd *fd_local;
  
  local_20 = fn;
  if (fn != (char *)0x0) {
    local_21 = false;
    if (fd->embed_ref != 0) {
      local_21 = fd->mode == 0x72;
    }
    prVar2 = refs_load_fai(fd->refs,fn,(uint)((local_21 ^ 0xffU) & 1));
    fd->refs = prVar2;
    if (fd->refs == (refs_t *)0x0) {
      local_40 = (char *)0x0;
    }
    else {
      local_40 = fd->refs->fn;
    }
    local_20 = local_40;
  }
  fd->ref_fn = local_20;
  if (((fd->refs == (refs_t *)0x0) || ((fd->refs->nref == 0 && (local_20 == (char *)0x0)))) &&
     (fd->header != (SAM_hdr *)0x0)) {
    if (fd->refs != (refs_t *)0x0) {
      refs_free(fd->refs);
    }
    prVar2 = refs_create();
    fd->refs = prVar2;
    if (prVar2 == (refs_t *)0x0) {
      return -1;
    }
    iVar1 = refs_from_header(fd->refs,fd,fd->header);
    if (iVar1 == -1) {
      return -1;
    }
  }
  if ((fd->header == (SAM_hdr *)0x0) || (iVar1 = refs2id(fd->refs,fd->header), iVar1 != -1)) {
    fd_local._4_4_ = -1;
    if (local_20 != (char *)0x0) {
      fd_local._4_4_ = 0;
    }
  }
  else {
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

int cram_load_reference(cram_fd *fd, char *fn) {
    if (fn) {
	fd->refs = refs_load_fai(fd->refs, fn,
				 !(fd->embed_ref && fd->mode == 'r'));
	fn = fd->refs ? fd->refs->fn : NULL;
    }
    fd->ref_fn = fn;

    if ((!fd->refs || (fd->refs->nref == 0 && !fn)) && fd->header) {
	if (fd->refs)
	    refs_free(fd->refs);
	if (!(fd->refs = refs_create()))
	    return -1;
	if (-1 == refs_from_header(fd->refs, fd, fd->header))
	    return -1;
    }

    if (fd->header)
	if (-1 == refs2id(fd->refs, fd->header))
	    return -1;

    return fn ? 0 : -1;
}